

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O0

wchar_t tval_find_idx(char *name)

{
  _Bool _Var1;
  wchar_t wVar2;
  ulong uVar3;
  wchar_t local_3c;
  unsigned_long r;
  char *pe;
  char *mod_name;
  size_t i;
  char *name_local;
  
  i = (size_t)name;
  uVar3 = strtoul(name,(char **)&r,10);
  if (r == i) {
    pe = de_armour((char *)i);
    for (mod_name = (char *)0x0; mod_name < (char *)0x24; mod_name = mod_name + 1) {
      wVar2 = my_stricmp(pe,tval_names[(long)mod_name].name);
      if (wVar2 == L'\0') {
        string_free(pe);
        return tval_names[(long)mod_name].tval;
      }
    }
    string_free(pe);
    name_local._4_4_ = L'\xffffffff';
  }
  else {
    _Var1 = contains_only_spaces((char *)r);
    if ((_Var1) && (uVar3 < 0x24)) {
      local_3c = (wchar_t)uVar3;
    }
    else {
      local_3c = L'\xffffffff';
    }
    name_local._4_4_ = local_3c;
  }
  return name_local._4_4_;
}

Assistant:

int tval_find_idx(const char *name)
{
	size_t i;
	char *mod_name, *pe;
	unsigned long r = strtoul(name, &pe, 10);

	if (pe != name) {
		return (contains_only_spaces(pe) && r < TV_MAX) ? (int)r : -1;
	}

	mod_name = de_armour(name);

	for (i = 0; i < N_ELEMENTS(tval_names); i++) {
		if (!my_stricmp(mod_name, tval_names[i].name)) {
			string_free(mod_name);
			return tval_names[i].tval;
		}
	}

	string_free(mod_name);
	return -1;
}